

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

size_t __thiscall
google::protobuf::compiler::CodeGeneratorRequest::ByteSizeLong(CodeGeneratorRequest *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  UnknownFieldSet *unknown_fields;
  size_t sVar4;
  string *psVar5;
  FileDescriptorProto *value;
  uint local_48;
  int cached_size;
  uint i_1;
  uint count;
  int n;
  int i;
  size_t total_size;
  CodeGeneratorRequest *this_local;
  
  _n = 0;
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = CodeGeneratorRequest::unknown_fields(this);
    _n = internal::WireFormat::ComputeUnknownFieldsSize(unknown_fields);
  }
  iVar2 = file_to_generate_size(this);
  sVar4 = internal::FromIntSize(iVar2);
  _n = sVar4 + _n;
  count = 0;
  iVar2 = file_to_generate_size(this);
  for (; (int)count < iVar2; count = count + 1) {
    psVar5 = file_to_generate_abi_cxx11_(this,count);
    sVar4 = internal::WireFormatLite::StringSize(psVar5);
    _n = sVar4 + _n;
  }
  uVar3 = proto_file_size(this);
  _n = uVar3 + _n;
  for (local_48 = 0; local_48 < uVar3; local_48 = local_48 + 1) {
    value = proto_file(this,local_48);
    sVar4 = internal::WireFormatLite::MessageSizeNoVirtual<google::protobuf::FileDescriptorProto>
                      (value);
    _n = sVar4 + _n;
  }
  if (((this->_has_bits_).has_bits_[0] & 3) != 0) {
    bVar1 = has_parameter(this);
    if (bVar1) {
      psVar5 = parameter_abi_cxx11_(this);
      sVar4 = internal::WireFormatLite::StringSize(psVar5);
      _n = sVar4 + 1 + _n;
    }
    bVar1 = has_compiler_version(this);
    if (bVar1) {
      sVar4 = internal::WireFormatLite::MessageSizeNoVirtual<google::protobuf::compiler::Version>
                        (this->compiler_version_);
      _n = sVar4 + 1 + _n;
    }
  }
  iVar2 = internal::ToCachedSize(_n);
  this->_cached_size_ = iVar2;
  return _n;
}

Assistant:

size_t CodeGeneratorRequest::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.compiler.CodeGeneratorRequest)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  // repeated string file_to_generate = 1;
  total_size += 1 *
      ::google::protobuf::internal::FromIntSize(this->file_to_generate_size());
  for (int i = 0, n = this->file_to_generate_size(); i < n; i++) {
    total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
      this->file_to_generate(i));
  }

  // repeated .google.protobuf.FileDescriptorProto proto_file = 15;
  {
    unsigned int count = this->proto_file_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->proto_file(i));
    }
  }

  if (_has_bits_[0 / 32] & 3u) {
    // optional string parameter = 2;
    if (has_parameter()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->parameter());
    }

    // optional .google.protobuf.compiler.Version compiler_version = 3;
    if (has_compiler_version()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *this->compiler_version_);
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}